

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

hts_itr_t * cram_itr_query(hts_idx_t *idx,int tid,int beg,int end,hts_readrec_func *readrec)

{
  uint uVar1;
  int iVar2;
  hts_itr_t *__ptr;
  undefined4 extraout_var;
  long lVar3;
  cram_range r;
  bam_seq_t *apbStack_50 [2];
  int local_3c;
  int local_38;
  int local_34;
  
  lVar3 = 0x50;
  apbStack_50[0] = (bam_seq_t *)0x11363d;
  __ptr = (hts_itr_t *)calloc(1,0x50);
  if (__ptr != (hts_itr_t *)0x0) {
    uVar1 = *(uint *)__ptr;
    *(uint *)__ptr = uVar1 | 1;
    __ptr->off = (hts_pair64_t *)0x0;
    (__ptr->bins).a = (int *)0x0;
    __ptr->readrec = readrec;
    if (tid < 0) {
      if (tid == -5) {
        __ptr->curr_off = 0;
        *(uint *)__ptr = uVar1 | 3;
        return __ptr;
      }
      if (tid == -4) {
        __ptr->curr_off = 0;
        return __ptr;
      }
      apbStack_50[0] = (bam_seq_t *)cram_readrec;
      cram_itr_query_cold_1();
      iVar2 = cram_get_bam_seq(*(cram_fd **)(lVar3 + 0x38),apbStack_50);
      return (hts_itr_t *)CONCAT44(extraout_var,iVar2);
    }
    local_38 = beg + 1;
    apbStack_50[0] = (bam_seq_t *)0x113683;
    local_3c = tid;
    local_34 = end;
    iVar2 = cram_set_option(*(cram_fd **)&idx->n_lvls,CRAM_OPT_RANGE);
    if (iVar2 == 0) {
      __ptr->curr_off = 0;
      __ptr->tid = tid;
      __ptr->beg = beg;
      __ptr->end = end;
      return __ptr;
    }
    apbStack_50[0] = (bam_seq_t *)0x113692;
    free(__ptr);
  }
  return (hts_itr_t *)0x0;
}

Assistant:

static hts_itr_t *cram_itr_query(const hts_idx_t *idx, int tid, int beg, int end, hts_readrec_func *readrec)
{
    const hts_cram_idx_t *cidx = (const hts_cram_idx_t *) idx;
    hts_itr_t *iter = (hts_itr_t *) calloc(1, sizeof(hts_itr_t));
    if (iter == NULL) return NULL;

    // Cons up a dummy iterator for which hts_itr_next() will simply invoke
    // the readrec function:
    iter->read_rest = 1;
    iter->off = NULL;
    iter->bins.a = NULL;
    iter->readrec = readrec;

    if (tid >= 0) {
        cram_range r = { tid, beg+1, end };
        if (cram_set_option(cidx->cram, CRAM_OPT_RANGE, &r) != 0) { free(iter); return NULL; }
        iter->curr_off = 0;
        // The following fields are not required by hts_itr_next(), but are
        // filled in in case user code wants to look at them.
        iter->tid = tid;
        iter->beg = beg;
        iter->end = end;
    }
    else switch (tid) {
    case HTS_IDX_REST:
        iter->curr_off = 0;
        break;
    case HTS_IDX_NONE:
        iter->curr_off = 0;
        iter->finished = 1;
        break;
    default:
        fprintf(stderr, "[cram_itr_query] tid=%d not implemented for CRAM files -- Exiting\n", tid);
        abort();
        break;
    }

    return iter;
}